

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_option.hpp
# Opt level: O1

string * __thiscall
duckdb::CSVOption<duckdb::StrpTimeFormat>::FormatSet_abi_cxx11_
          (string *__return_storage_ptr__,CSVOption<duckdb::StrpTimeFormat> *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  
  bVar1 = this->set_by_user;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (bVar1 == true) {
    pcVar3 = "(Set By User)";
    pcVar2 = "";
  }
  else {
    pcVar3 = "(Auto-Detected)";
    pcVar2 = "";
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

string FormatSet() const {
		if (set_by_user) {
			return "(Set By User)";
		}
		return "(Auto-Detected)";
	}